

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

ValuedAction __thiscall despot::DPOMCP::Search(DPOMCP *this,double timeout)

{
  Belief *pBVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  int iVar4;
  clock_t cVar5;
  VNode *pVVar6;
  log_ostream *plVar7;
  clock_t cVar8;
  ostream *poVar9;
  QNode *pQVar10;
  int i;
  ulong uVar11;
  double dVar12;
  double dVar13;
  ValuedAction VVar14;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  RandomStreams streams;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_68;
  RandomStreams local_50;
  
  cVar5 = clock();
  dVar12 = get_time_second();
  pBVar1 = (this->super_POMCP).super_Solver.belief_;
  (*pBVar1->_vptr_Belief[2])(&local_68,pBVar1,(ulong)(uint)DAT_0019fdcc);
  RandomStreams::RandomStreams(&local_50,DAT_0019fdcc,DAT_0019fdd0);
  pVVar6 = ConstructTree((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_68,
                         &local_50,(this->super_POMCP).super_Solver.model_,
                         (this->super_POMCP).prior_,&(this->super_POMCP).super_Solver.history_,
                         timeout);
  (this->super_POMCP).root_ = pVVar6;
  uVar11 = 0;
  while( true ) {
    if ((ulong)((long)local_68._M_impl.super__Vector_impl_data._M_finish -
                (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar11) break;
    pDVar2 = (this->super_POMCP).super_Solver.model_;
    (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,local_68._M_impl.super__Vector_impl_data._M_start[uVar11])
    ;
    uVar11 = uVar11 + 1;
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar7 = logging::stream(3);
      std::operator<<(&plVar7->super_ostream,"[DPOMCP::Search] Time: CPU / Real = ");
      cVar8 = clock();
      poVar9 = std::ostream::_M_insert<double>(((double)cVar8 - (double)cVar5) / 1000000.0);
      std::operator<<(poVar9," / ");
      dVar13 = get_time_second();
      poVar9 = std::ostream::_M_insert<double>(dVar13 - dVar12);
      poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<(poVar9,"Tree size = ");
      iVar3 = VNode::Size((this->super_POMCP).root_);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  VVar14 = POMCP::OptimalAction((this->super_POMCP).root_);
  if (VVar14.action == 0xffffffff) {
    iVar3 = 0;
    while( true ) {
      iVar4 = (*((this->super_POMCP).super_Solver.model_)->_vptr_DSPOMDP[5])();
      if (iVar4 <= iVar3) break;
      poVar9 = std::operator<<((ostream *)&std::cout,"action ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
      poVar9 = std::operator<<(poVar9,": ");
      pQVar10 = VNode::Child((this->super_POMCP).root_,iVar3);
      iVar4 = QNode::count(pQVar10);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
      std::operator<<(poVar9," ");
      pQVar10 = VNode::Child((this->super_POMCP).root_,iVar3);
      dVar12 = QNode::value(pQVar10);
      poVar9 = std::ostream::_M_insert<double>(dVar12);
      std::endl<char,std::char_traits<char>>(poVar9);
      iVar3 = iVar3 + 1;
    }
  }
  pVVar6 = (this->super_POMCP).root_;
  if (pVVar6 != (VNode *)0x0) {
    VNode::~VNode(pVVar6);
  }
  operator_delete(pVVar6,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_50.streams_);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_68);
  VVar14._4_4_ = 0;
  return VVar14;
}

Assistant:

ValuedAction DPOMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);

	RandomStreams streams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	root_ = ConstructTree(particles, streams, model_, prior_, history_,
		timeout);

	for (int i = 0; i < particles.size(); i++)
		model_->Free(particles[i]);

	logi << "[DPOMCP::Search] Time: CPU / Real = "
		<< ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / "
		<< (get_time_second() - start_real) << endl << "Tree size = "
		<< root_->Size() << endl;

	ValuedAction astar = OptimalAction(root_);
	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	delete root_;
	return astar;
}